

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

optional<supermap::ByteArray<2UL>_> __thiscall
supermap::Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long>::getValue
          (Supermap<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long> *this,Key<2UL> *k)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  KeyValue<supermap::Key<2UL>,_unsigned_long> *pKVar5;
  pointer pKVar6;
  anon_class_1_0_00000001 *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  _Storage<supermap::ByteArray<2UL>,_false> in_RDI;
  optional<supermap::ByteArray<2UL>_> oVar8;
  optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> foundOnDisk;
  optional<unsigned_long> optIndex;
  unsigned_long index;
  ByteArray<2UL> *in_stack_ffffffffffffff08;
  pointer in_stack_ffffffffffffff10;
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
  *this_00;
  undefined1 local_b8 [40];
  undefined1 local_90 [40];
  function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
  local_68;
  undefined1 local_48 [24];
  undefined8 local_30;
  unsigned_long local_20;
  anon_class_1_0_00000001 *local_18;
  
  local_18 = in_RDX;
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x2b18e2);
  iVar2 = (*(pEVar3->super_KeyValueStorage<supermap::Key<2UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[1])(pEVar3,local_18);
  local_30 = CONCAT44(extraout_var,iVar2);
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)0x2b190f);
  if (bVar1) {
    puVar4 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_ffffffffffffff10);
    local_20 = *puVar4;
  }
  else {
    in_stack_ffffffffffffff10 =
         std::
         unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>
         ::operator->((unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>,_supermap::Key<2UL>_>_>_>_>
                       *)0x2b1940);
    this_00 = &local_68;
    std::
    function<bool(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::Key<2ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long>::getValue(supermap::Key<2ul>const&)::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::Key<2ul>const&)_1_,void>
              (this_00,local_18);
    std::
    function<bool(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::Key<2ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<2ul>,supermap::ByteArray<2ul>,unsigned_long>::getValue(supermap::Key<2ul>const&)::_lambda(supermap::KeyValue<supermap::Key<2ul>,unsigned_long>const&,supermap::Key<2ul>const&)_2_,void>
              (this_00,local_18);
    (**(in_stack_ffffffffffffff10->
       super_Findable<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>,_supermap::Key<2UL>_>).
       _vptr_Findable)(local_48,in_stack_ffffffffffffff10,local_18,this_00,local_90);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
                 *)0x2b19b0);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_&,_const_supermap::Key<2UL>_&)>
                 *)0x2b19bd);
    bVar1 = std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>::has_value
                      ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> *)0x2b19ca)
    ;
    if (!bVar1) {
      std::optional<supermap::ByteArray<2UL>_>::optional
                ((optional<supermap::ByteArray<2UL>_> *)in_RDI);
      uVar7 = extraout_RDX;
      goto LAB_002b1a5e;
    }
    pKVar5 = std::optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_>::value
                       ((optional<supermap::KeyValue<supermap::Key<2UL>,_unsigned_long>_> *)
                        in_stack_ffffffffffffff10);
    local_20 = pKVar5->value;
  }
  pKVar6 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<2UL>,_supermap::ByteArray<2UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<2UL>_>_>_>_>_>
                         *)0x2b1a2b);
  (*(pKVar6->
    super_IndexedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
    ).
    super_OrderedStorage<supermap::KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>,_unsigned_long,_void>
    ._vptr_OrderedStorage[4])(local_b8,pKVar6,local_20);
  std::optional<supermap::ByteArray<2UL>_>::optional<supermap::ByteArray<2UL>,_true>
            ((optional<supermap::ByteArray<2UL>_> *)in_stack_ffffffffffffff10,
             in_stack_ffffffffffffff08);
  KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_>::~KeyValue
            ((KeyValue<supermap::Key<2UL>,_supermap::ByteArray<2UL>_> *)0x2b1a5e);
  uVar7 = extraout_RDX_00;
LAB_002b1a5e:
  oVar8.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<2UL>_>._8_8_ = uVar7;
  oVar8.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<2UL>_>._M_payload = in_RDI;
  return (optional<supermap::ByteArray<2UL>_>)
         oVar8.super__Optional_base<supermap::ByteArray<2UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<2UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<2UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }